

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pointer.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
__thiscall
duckdb::ColumnSegmentState::Deserialize(ColumnSegmentState *this,Deserializer *deserializer)

{
  CompressionType type;
  DatabaseInstance *db;
  LogicalType *pLVar1;
  DBConfig *this_00;
  SerializationException *this_01;
  optional_ptr<duckdb::CompressionFunction,_true> compression_function;
  optional_ptr<duckdb::CompressionFunction,_true> local_50;
  string local_48;
  
  type = Deserializer::Get<duckdb::CompressionType>(deserializer);
  db = Deserializer::Get<duckdb::DatabaseInstance&>(deserializer);
  pLVar1 = Deserializer::Get<duckdb::LogicalType_const&>(deserializer);
  this_00 = DBConfig::GetConfig(db);
  local_50 = DBConfig::GetCompressionFunction(this_00,type,pLVar1->physical_type_);
  if (local_50.ptr != (CompressionFunction *)0x0) {
    optional_ptr<duckdb::CompressionFunction,_true>::CheckValid(&local_50);
    if ((local_50.ptr)->deserialize_state != (compression_deserialize_state_t)0x0) {
      optional_ptr<duckdb::CompressionFunction,_true>::CheckValid(&local_50);
      (*(local_50.ptr)->deserialize_state)((Deserializer *)this);
      return (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
              )(unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
                )this;
    }
  }
  this_01 = (SerializationException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Deserializing a ColumnSegmentState but could not find deserialize method","");
  SerializationException::SerializationException(this_01,&local_48);
  __cxa_throw(this_01,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ColumnSegmentState> ColumnSegmentState::Deserialize(Deserializer &deserializer) {
	auto compression_type = deserializer.Get<CompressionType>();
	auto &db = deserializer.Get<DatabaseInstance &>();
	auto &type = deserializer.Get<const LogicalType &>();

	auto compression_function = DBConfig::GetConfig(db).GetCompressionFunction(compression_type, type.InternalType());
	if (!compression_function || !compression_function->deserialize_state) {
		throw SerializationException("Deserializing a ColumnSegmentState but could not find deserialize method");
	}
	return compression_function->deserialize_state(deserializer);
}